

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

int oonf_cfg_update_globalcfg(_Bool raw)

{
  int iVar1;
  undefined8 uVar2;
  cfg_db *local_28;
  int result;
  cfg_named_section *named;
  _Bool raw_local;
  
  if (raw) {
    local_28 = _oonf_raw_db;
  }
  else {
    local_28 = _oonf_work_db;
  }
  uVar2 = cfg_db_find_namedsection(local_28,"global",0);
  iVar1 = cfg_schema_tobin(&config_global,uVar2,_global_entries,6);
  oonf_subsystem_set_path(config_global.plugin_path);
  return iVar1;
}

Assistant:

int
oonf_cfg_update_globalcfg(bool raw) {
  struct cfg_named_section *named;
  int result;

  named = cfg_db_find_namedsection(raw ? _oonf_raw_db : _oonf_work_db, CFG_SECTION_GLOBAL, NULL);

  result = cfg_schema_tobin(&config_global, named, _global_entries, ARRAYSIZE(_global_entries));

  /* set plugin path */
  oonf_subsystem_set_path(config_global.plugin_path);

  return result;
}